

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateCWellKnownTypes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,GeneratorContext *context)

{
  _anonymous_namespace_ *p_Var1;
  undefined4 uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  pointer pZVar8;
  DescriptorStringView psVar9;
  unsigned_long __val;
  ulong uVar10;
  reference ppFVar11;
  Descriptor *pDVar12;
  EnumDescriptor *pEVar13;
  Options *options;
  FileDescriptor *file_00;
  FileDescriptor *file_01;
  string_view filename;
  string_view filename_00;
  undefined1 auVar14 [16];
  string_view local_6c0;
  int local_6b0;
  int local_6ac;
  int i_5;
  int i_4;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_698;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_678;
  undefined8 local_670;
  undefined1 local_668 [16];
  undefined1 local_658 [8];
  string metadata_c_name_1;
  undefined1 local_628 [8];
  string metadata_classname_1;
  undefined1 local_5d8 [8];
  string metadata_filename_1;
  FileDescriptor *file_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3_2;
  int local_588;
  int local_584;
  int i_3;
  int i_2;
  string_view local_570;
  undefined1 local_560 [8];
  string dep_c_name;
  undefined1 auStack_538 [4];
  int i_1;
  string_view local_528;
  string local_518 [32];
  undefined1 local_4f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string_view local_4c8;
  ulong local_4b8;
  size_t j;
  size_t i;
  string_view local_488;
  string local_478 [8];
  string serialized;
  FileDescriptorProto file_proto;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_378;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_358;
  undefined8 local_350;
  undefined1 local_348 [16];
  string local_338 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_318;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  string metadata_c_name;
  undefined1 local_2a8 [8];
  string metadata_classname;
  undefined1 local_258 [8];
  string metadata_filename;
  string c_name;
  FileDescriptor *file_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3_1;
  string_view local_1d8;
  _anonymous_namespace_ *local_1c8;
  FileDescriptor *file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3;
  string_view local_198;
  Printer local_188 [8];
  Printer printer;
  allocator<char> local_41;
  string local_40 [32];
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_20;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  GeneratorContext *context_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  
  output._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,_true,_true>
          )context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"../ext/google/protobuf/wkt.inc",&local_41);
  iVar5 = (*context->_vptr_GeneratorContext[2])(context,local_40);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              *)&local_20,(pointer)CONCAT44(extraout_var,iVar5));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pZVar8 = std::
           unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           ::get(&local_20);
  options = (Options *)0x0;
  google::protobuf::io::Printer::Printer(local_188,pZVar8,'$',(AnnotationCollector *)0x0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,
             "// This file is generated from the .proto files for the well-known\n// types. Do not edit!\n\n"
            );
  io::Printer::Print<>(local_188,local_198);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,
             "ZEND_BEGIN_ARG_INFO_EX(arginfo_lookup, 0, 0, 1)\n  ZEND_ARG_INFO(0, key)\nZEND_END_ARG_INFO()\n\n"
            );
  io::Printer::Print<>(local_188,___range3);
  __end3 = std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::begin(files);
  file = (FileDescriptor *)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::end(files);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                *)&file);
    if (!bVar4) break;
    ppFVar11 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
               ::operator*(&__end3);
    local_1c8 = (_anonymous_namespace_ *)*ppFVar11;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,"static void $c_name$_AddDescriptor();\n");
    (anonymous_namespace)::FilenameCName_abi_cxx11_((string *)&__range3_1,local_1c8,file_00);
    options = (Options *)0x6b7b30;
    io::Printer::Print<char[7],std::__cxx11::string>
              (local_188,local_1d8,(char (*) [7])0x6b7b30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3_1);
    std::__cxx11::string::~string((string *)&__range3_1);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  __end3_1 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(files);
  file_1 = (FileDescriptor *)
           std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::end(files);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end3_1,
                       (__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                        *)&file_1);
    if (!bVar4) break;
    ppFVar11 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
               ::operator*(&__end3_1);
    p_Var1 = (_anonymous_namespace_ *)*ppFVar11;
    (anonymous_namespace)::FilenameCName_abi_cxx11_
              ((string *)((long)&metadata_filename.field_2 + 8),p_Var1,file_01);
    metadata_classname.field_2._8_8_ = 0;
    php::Options::Options((Options *)((long)&metadata_classname.field_2 + 8));
    (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
              ((string *)local_258,p_Var1,
               (FileDescriptor *)(metadata_classname.field_2._M_local_buf + 8),options);
    php::Options::~Options((Options *)((long)&metadata_classname.field_2 + 8));
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_258);
    filename._M_len = auVar14._8_8_;
    metadata_c_name.field_2._8_8_ = auVar14._0_8_;
    filename._M_str = &options->is_descriptor;
    (anonymous_namespace)::FilenameToClassname_abi_cxx11_
              ((string *)local_2a8,(_anonymous_namespace_ *)metadata_c_name.field_2._8_8_,filename);
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2a8);
    local_2e8 = auVar14;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
              (&local_318,(char (*) [2])0x55718b,(char (*) [2])0x6bc912);
    local_2f8 = &local_318;
    local_2f0 = 1;
    absl::lts_20240722::StrReplaceAll_abi_cxx11_
              (local_2d8,local_2e8._0_8_,local_2e8._8_8_,local_2f8,1);
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2a8);
    local_348 = auVar14;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
              (&local_378,(char (*) [2])0x55718b,(char (*) [3])"\\\\");
    local_358 = &local_378;
    local_350 = 1;
    absl::lts_20240722::StrReplaceAll_abi_cxx11_
              (local_338,local_348._0_8_,local_348._8_8_,local_358,1);
    std::__cxx11::string::operator=((string *)local_2a8,local_338);
    std::__cxx11::string::~string(local_338);
    StripSourceRetentionOptions
              ((compiler *)(serialized.field_2._M_local_buf + 8),(FileDescriptor *)p_Var1,false);
    std::__cxx11::string::string(local_478);
    google::protobuf::MessageLite::SerializeToString
              ((string *)(serialized.field_2._M_local_buf + 8));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_488,
               "/* $filename$ */\n\nzend_class_entry* $metadata_c_name$_ce;\n\nconst char $c_name$_descriptor [$size$] = {\n"
              );
    psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)p_Var1);
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)&i,__val);
    io::Printer::
    Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[5],std::__cxx11::string>
              (local_188,local_488,(char (*) [9])"filename",psVar9,(char (*) [7])0x6b7b30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&metadata_filename.field_2 + 8),(char (*) [16])"metadata_c_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
               (char (*) [5])0x5bbac7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::__cxx11::string::~string((string *)&i);
    j = 0;
    while( true ) {
      sVar3 = j;
      uVar10 = std::__cxx11::string::size();
      if (uVar10 <= sVar3) break;
      local_4b8 = 0;
      while( true ) {
        sVar3 = j;
        bVar4 = false;
        if (local_4b8 < 0x19) {
          uVar10 = std::__cxx11::string::size();
          bVar4 = sVar3 < uVar10;
        }
        if (!bVar4) break;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_4c8,"\'$ch$\', ");
        std::__cxx11::string::substr((ulong)local_518,(ulong)local_478);
        auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view(local_518);
        local_4f8 = auVar14;
        absl::lts_20240722::CEscape_abi_cxx11_(&local_4e8,auVar14._0_8_,auVar14._8_8_);
        io::Printer::Print<char[3],std::__cxx11::string>
                  (local_188,local_4c8,(char (*) [3])0x6adef4,&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string(local_518);
        j = j + 1;
        local_4b8 = local_4b8 + 1;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_528,"\n");
      io::Printer::Print<>(local_188,local_528);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_538,
               "};\n\nstatic void $c_name$_AddDescriptor() {\n  if (DescriptorPool_HasFile(\"$filename$\")) return;\n"
              );
    psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)p_Var1);
    io::Printer::
    Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string>
              (local_188,_auStack_538,(char (*) [9])"filename",psVar9,(char (*) [7])0x6b7b30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&metadata_filename.field_2 + 8),(char (*) [16])"metadata_c_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8);
    dep_c_name.field_2._12_4_ = 0;
    while( true ) {
      uVar2 = dep_c_name.field_2._12_4_;
      iVar5 = FileDescriptor::dependency_count((FileDescriptor *)p_Var1);
      if (iVar5 <= (int)uVar2) break;
      auVar14 = google::protobuf::FileDescriptor::dependency((int)p_Var1);
      (anonymous_namespace)::FilenameCName_abi_cxx11_
                ((string *)local_560,auVar14._0_8_,auVar14._8_8_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_570,"  $dep_c_name$_AddDescriptor();\n");
      io::Printer::Print<char[11],std::__cxx11::string>
                (local_188,local_570,(char (*) [11])"dep_c_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
      std::__cxx11::string::~string((string *)local_560);
      dep_c_name.field_2._12_4_ = dep_c_name.field_2._12_4_ + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&i_3,
               "  DescriptorPool_AddDescriptor(\"$filename$\", $c_name$_descriptor,\n                               sizeof($c_name$_descriptor));\n}\n\nstatic PHP_METHOD($metadata_c_name$, initOnce) {\n  $c_name$_AddDescriptor();\n}\n\nstatic zend_function_entry $metadata_c_name$_methods[] = {\n  PHP_ME($metadata_c_name$, initOnce, arginfo_void, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $metadata_c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$metadata_classname$\",\n                   $metadata_c_name$_methods);\n\n  $metadata_c_name$_ce = zend_register_internal_class(&tmp_ce);\n}\n\n"
              );
    psVar9 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)p_Var1);
    io::Printer::
    Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[19],std::__cxx11::string>
              (local_188,_i_3,(char (*) [9])"filename",psVar9,(char (*) [7])0x6b7b30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&metadata_filename.field_2 + 8),(char (*) [16])"metadata_c_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
               (char (*) [19])"metadata_classname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    local_584 = 0;
    while( true ) {
      iVar5 = local_584;
      iVar6 = FileDescriptor::message_type_count((FileDescriptor *)p_Var1);
      if (iVar6 <= iVar5) break;
      pDVar12 = FileDescriptor::message_type((FileDescriptor *)p_Var1,local_584);
      GenerateCMessage(pDVar12,local_188);
      local_584 = local_584 + 1;
    }
    local_588 = 0;
    while( true ) {
      iVar5 = local_588;
      uVar7 = FileDescriptor::enum_type_count((FileDescriptor *)p_Var1);
      options = (Options *)(ulong)uVar7;
      if ((int)uVar7 <= iVar5) break;
      pEVar13 = FileDescriptor::enum_type((FileDescriptor *)p_Var1,local_588);
      GenerateCEnum(pEVar13,local_188);
      local_588 = local_588 + 1;
    }
    std::__cxx11::string::~string(local_478);
    google::protobuf::FileDescriptorProto::~FileDescriptorProto
              ((FileDescriptorProto *)(serialized.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2d8);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::string::~string((string *)(metadata_filename.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end3_1);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range3_2,
             "static void WellKnownTypes_ModuleInit() {\n");
  io::Printer::Print<>(local_188,___range3_2);
  __end3_2 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(files);
  file_2 = (FileDescriptor *)
           std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::end(files);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end3_2,
                       (__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                        *)&file_2);
    if (!bVar4) break;
    ppFVar11 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
               ::operator*(&__end3_2);
    p_Var1 = (_anonymous_namespace_ *)*ppFVar11;
    metadata_classname_1.field_2._8_8_ = 0;
    metadata_filename_1.field_2._8_8_ = p_Var1;
    php::Options::Options((Options *)((long)&metadata_classname_1.field_2 + 8));
    (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
              ((string *)local_5d8,p_Var1,
               (FileDescriptor *)(metadata_classname_1.field_2._M_local_buf + 8),options);
    php::Options::~Options((Options *)((long)&metadata_classname_1.field_2 + 8));
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_5d8);
    filename_00._M_len = auVar14._8_8_;
    metadata_c_name_1.field_2._8_8_ = auVar14._0_8_;
    filename_00._M_str = &options->is_descriptor;
    (anonymous_namespace)::FilenameToClassname_abi_cxx11_
              ((string *)local_628,(_anonymous_namespace_ *)metadata_c_name_1.field_2._8_8_,
               filename_00);
    auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_628);
    local_668 = auVar14;
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
              (&local_698,(char (*) [2])0x55718b,(char (*) [2])0x6bc912);
    local_678 = &local_698;
    local_670 = 1;
    absl::lts_20240722::StrReplaceAll_abi_cxx11_
              (local_658,local_668._0_8_,local_668._8_8_,local_678,1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&i_5,
               "  $metadata_c_name$_ModuleInit();\n");
    io::Printer::Print<char[16],std::__cxx11::string>
              (local_188,_i_5,(char (*) [16])"metadata_c_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658);
    local_6ac = 0;
    while( true ) {
      iVar5 = local_6ac;
      iVar6 = FileDescriptor::message_type_count
                        ((FileDescriptor *)metadata_filename_1.field_2._8_8_);
      if (iVar6 <= iVar5) break;
      pDVar12 = FileDescriptor::message_type
                          ((FileDescriptor *)metadata_filename_1.field_2._8_8_,local_6ac);
      GenerateCInit(pDVar12,local_188);
      local_6ac = local_6ac + 1;
    }
    local_6b0 = 0;
    while( true ) {
      iVar5 = local_6b0;
      uVar7 = FileDescriptor::enum_type_count((FileDescriptor *)metadata_filename_1.field_2._8_8_);
      options = (Options *)(ulong)uVar7;
      if ((int)uVar7 <= iVar5) break;
      pEVar13 = FileDescriptor::enum_type
                          ((FileDescriptor *)metadata_filename_1.field_2._8_8_,local_6b0);
      GenerateEnumCInit(pEVar13,local_188);
      local_6b0 = local_6b0 + 1;
    }
    std::__cxx11::string::~string((string *)local_658);
    std::__cxx11::string::~string((string *)local_628);
    std::__cxx11::string::~string((string *)local_5d8);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&__end3_2);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6c0,"}\n");
  io::Printer::Print<>(local_188,local_6c0);
  io::Printer::~Printer(local_188);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void GenerateCWellKnownTypes(const std::vector<const FileDescriptor*>& files,
                             GeneratorContext* context) {
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      context->Open("../ext/google/protobuf/wkt.inc"));
  io::Printer printer(output.get(), '$');

  printer.Print(
      "// This file is generated from the .proto files for the well-known\n"
      "// types. Do not edit!\n\n");

  printer.Print(
      "ZEND_BEGIN_ARG_INFO_EX(arginfo_lookup, 0, 0, 1)\n"
      "  ZEND_ARG_INFO(0, key)\n"
      "ZEND_END_ARG_INFO()\n"
      "\n");

  for (auto file : files) {
    printer.Print("static void $c_name$_AddDescriptor();\n", "c_name",
                  FilenameCName(file));
  }

  for (auto file : files) {
    std::string c_name = FilenameCName(file);
    std::string metadata_filename = GeneratedMetadataFileName(file, Options());
    std::string metadata_classname = FilenameToClassname(metadata_filename);
    std::string metadata_c_name =
        absl::StrReplaceAll(metadata_classname, {{"\\", "_"}});
    metadata_classname =
        absl::StrReplaceAll(metadata_classname, {{"\\", "\\\\"}});
    FileDescriptorProto file_proto = StripSourceRetentionOptions(*file);
    std::string serialized;
    file_proto.SerializeToString(&serialized);
    printer.Print(
        "/* $filename$ */\n"
        "\n"
        "zend_class_entry* $metadata_c_name$_ce;\n"
        "\n"
        "const char $c_name$_descriptor [$size$] = {\n",
        "filename", file->name(), "c_name", c_name, "metadata_c_name",
        metadata_c_name, "size", std::to_string(serialized.size()));

    for (size_t i = 0; i < serialized.size();) {
      for (size_t j = 0; j < 25 && i < serialized.size(); ++i, ++j) {
        printer.Print("'$ch$', ", "ch", absl::CEscape(serialized.substr(i, 1)));
      }
      printer.Print("\n");
    }

    printer.Print(
        "};\n"
        "\n"
        "static void $c_name$_AddDescriptor() {\n"
        "  if (DescriptorPool_HasFile(\"$filename$\")) return;\n",
        "filename", file->name(), "c_name", c_name, "metadata_c_name",
        metadata_c_name);

    for (int i = 0; i < file->dependency_count(); i++) {
      std::string dep_c_name = FilenameCName(file->dependency(i));
      printer.Print("  $dep_c_name$_AddDescriptor();\n", "dep_c_name",
                    dep_c_name);
    }

    printer.Print(
        "  DescriptorPool_AddDescriptor(\"$filename$\", $c_name$_descriptor,\n"
        "                               sizeof($c_name$_descriptor));\n"
        "}\n"
        "\n"
        "static PHP_METHOD($metadata_c_name$, initOnce) {\n"
        "  $c_name$_AddDescriptor();\n"
        "}\n"
        "\n"
        "static zend_function_entry $metadata_c_name$_methods[] = {\n"
        "  PHP_ME($metadata_c_name$, initOnce, arginfo_void, ZEND_ACC_PUBLIC | "
        "ZEND_ACC_STATIC)\n"
        "  ZEND_FE_END\n"
        "};\n"
        "\n"
        "static void $metadata_c_name$_ModuleInit() {\n"
        "  zend_class_entry tmp_ce;\n"
        "\n"
        "  INIT_CLASS_ENTRY(tmp_ce, \"$metadata_classname$\",\n"
        "                   $metadata_c_name$_methods);\n"
        "\n"
        "  $metadata_c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
        "}\n"
        "\n",
        "filename", file->name(), "c_name", c_name, "metadata_c_name",
        metadata_c_name, "metadata_classname", metadata_classname);
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateCMessage(file->message_type(i), &printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateCEnum(file->enum_type(i), &printer);
    }
  }

  printer.Print("static void WellKnownTypes_ModuleInit() {\n");

  for (auto file : files) {
    std::string metadata_filename = GeneratedMetadataFileName(file, Options());
    std::string metadata_classname = FilenameToClassname(metadata_filename);
    std::string metadata_c_name =
        absl::StrReplaceAll(metadata_classname, {{"\\", "_"}});
    printer.Print("  $metadata_c_name$_ModuleInit();\n", "metadata_c_name",
                  metadata_c_name);
    for (int i = 0; i < file->message_type_count(); i++) {
      GenerateCInit(file->message_type(i), &printer);
    }
    for (int i = 0; i < file->enum_type_count(); i++) {
      GenerateEnumCInit(file->enum_type(i), &printer);
    }
  }

  printer.Print("}\n");
}